

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O1

void __thiscall
Disa::Adjacency_Graph<false>::insert_vertex_adjacent_list
          (Adjacency_Graph<false> *this,size_t vertex,size_t insert_vertex)

{
  pointer puVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  ulong *puVar4;
  ulong uVar5;
  ulong uVar6;
  const_iterator __position;
  difference_type __d;
  size_t local_8;
  
  puVar1 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = puVar1[vertex];
  uVar3 = puVar1[vertex + 1];
  __position._M_current =
       (this->vertex_adjacent_list).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start + uVar2;
  uVar5 = uVar3 - uVar2;
  if (uVar5 != 0 && (long)uVar2 <= (long)uVar3) {
    do {
      uVar6 = uVar5 >> 1;
      uVar5 = ~uVar6 + uVar5;
      puVar4 = __position._M_current + uVar6 + 1;
      if (insert_vertex <= __position._M_current[uVar6]) {
        uVar5 = uVar6;
        puVar4 = __position._M_current;
      }
      __position._M_current = puVar4;
    } while (0 < (long)uVar5);
  }
  local_8 = insert_vertex;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::insert
            (&this->vertex_adjacent_list,__position,&local_8);
  return;
}

Assistant:

void Adjacency_Graph<_directed>::insert_vertex_adjacent_list(std::size_t vertex, std::size_t insert_vertex) {
  const auto& adjacency = vertex_adjacency_iter(vertex);
  const auto& insert_iter = std::lower_bound(adjacency.first, adjacency.second, insert_vertex);
  const auto& distance = std::distance(vertex_adjacent_list.begin(), insert_iter);
  vertex_adjacent_list.insert(vertex_adjacent_list.begin() + distance, insert_vertex);
}